

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O1

int Cbs0_ManSolve_rec(Cbs0_Man_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  int iVar8;
  Gia_Obj_t **ppGVar9;
  Gia_Obj_t *pGVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  Gia_Obj_t *pGVar16;
  long lVar17;
  bool bVar18;
  
  if ((p->pProp).iHead == (p->pProp).iTail) {
    __assert_fail("!Cbs0_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                  ,0x24f,"int Cbs0_ManSolve_rec(Cbs0_Man_t *)");
  }
  iVar7 = Cbs0_ManPropagate(p);
  if (iVar7 != 0) {
    return 1;
  }
  iVar7 = (p->pProp).iHead;
  if (iVar7 != (p->pProp).iTail) {
    __assert_fail("Cbs0_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                  ,0x253,"int Cbs0_ManSolve_rec(Cbs0_Man_t *)");
  }
  iVar2 = (p->pJust).iHead;
  iVar3 = (p->pJust).iTail;
  iVar13 = 0;
  if (iVar2 == iVar3) {
    return 0;
  }
  iVar8 = (p->Pars).nJustThis;
  iVar11 = (p->pJust).iTail - iVar2;
  if (iVar11 < iVar8) {
    iVar11 = iVar8;
  }
  (p->Pars).nJustThis = iVar11;
  if ((p->Pars).nJustLimit < iVar11) {
    return 0;
  }
  if ((p->Pars).nBTLimit < (p->Pars).nBTThis) {
    return 0;
  }
  lVar15 = (long)iVar3;
  if (iVar2 < iVar3) {
    lVar17 = (long)iVar2;
    do {
      ppGVar9 = (p->pJust).pData;
      pGVar16 = ppGVar9[lVar17];
      iVar8 = (p->pJust).nSize;
      if ((p->pJust).iTail == iVar8) {
        (p->pJust).nSize = iVar8 * 2;
        if (ppGVar9 == (Gia_Obj_t **)0x0) {
          ppGVar9 = (Gia_Obj_t **)malloc((long)iVar8 << 4);
        }
        else {
          ppGVar9 = (Gia_Obj_t **)realloc(ppGVar9,(long)iVar8 << 4);
        }
        (p->pJust).pData = ppGVar9;
      }
      iVar8 = (p->pJust).iTail;
      (p->pJust).iTail = iVar8 + 1;
      (p->pJust).pData[iVar8] = pGVar16;
      lVar17 = lVar17 + 1;
    } while (lVar15 != lVar17);
  }
  (p->pJust).iHead = iVar3;
  if ((p->Pars).fUseHighest == 0) {
    if ((p->Pars).fUseLowest == 0) {
      if ((p->Pars).fUseMaxFF == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                      ,0x264,"int Cbs0_ManSolve_rec(Cbs0_Man_t *)");
      }
      pGVar16 = Cbs0_ManDecideMaxFF(p);
      goto LAB_0071103a;
    }
    iVar8 = (p->pJust).iTail;
    if (iVar3 < iVar8) {
      pGVar16 = (Gia_Obj_t *)0x0;
      do {
        pGVar4 = (p->pJust).pData[lVar15];
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        pGVar10 = pGVar16;
        if (pGVar4 < pGVar16) {
          pGVar10 = pGVar4;
        }
        bVar18 = pGVar16 == (Gia_Obj_t *)0x0;
        pGVar16 = pGVar10;
        if (bVar18) {
          pGVar16 = pGVar4;
        }
        lVar15 = lVar15 + 1;
      } while (iVar8 != lVar15);
      goto LAB_0071103a;
    }
  }
  else {
    iVar8 = (p->pJust).iTail;
    if (iVar3 < iVar8) {
      pGVar16 = (Gia_Obj_t *)0x0;
      do {
        pGVar4 = (p->pJust).pData[lVar15];
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        if (pGVar16 < pGVar4) {
          pGVar16 = pGVar4;
        }
        lVar15 = lVar15 + 1;
      } while (iVar8 != lVar15);
      goto LAB_0071103a;
    }
  }
  pGVar16 = (Gia_Obj_t *)0x0;
LAB_0071103a:
  uVar5 = *(ulong *)pGVar16;
  if (((((int)(uint)uVar5 < 0) || (uVar12 = (uint)uVar5 & 0x1fffffff, uVar12 == 0x1fffffff)) ||
      ((pGVar16[-(ulong)uVar12].field_0x3 & 0x40) != 0)) ||
     (uVar14 = (uint)(uVar5 >> 0x20), (pGVar16[-(ulong)(uVar14 & 0x1fffffff)].field_0x3 & 0x40) != 0
     )) {
    __assert_fail("Cbs0_VarIsJust( pVar )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                  ,0x265,"int Cbs0_ManSolve_rec(Cbs0_Man_t *)");
  }
  pGVar6 = p->pAig;
  pGVar4 = pGVar16 + -(ulong)uVar12;
  pGVar10 = pGVar6->pObjs;
  if (((pGVar4 < pGVar10) || (pGVar10 + pGVar6->nObjs <= pGVar4)) ||
     ((pGVar16 = pGVar16 + -(ulong)(uVar14 & 0x1fffffff), pGVar16 < pGVar10 ||
      (pGVar10 + pGVar6->nObjs <= pGVar16)))) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar11 = pGVar6->pRefs[(int)((ulong)((long)pGVar4 - (long)pGVar10) >> 2) * -0x55555555];
  iVar8 = pGVar6->pRefs[(int)((ulong)((long)pGVar16 - (long)pGVar10) >> 2) * -0x55555555];
  if (iVar8 < iVar11) {
    pGVar16 = pGVar4;
  }
  pGVar16 = (Gia_Obj_t *)
            ((ulong)((uVar5 >> ((iVar11 <= iVar8) << 5 | 0x1dU) & 1) != 0) ^ (ulong)pGVar16);
  Cbs0_ManAssign(p,(Gia_Obj_t *)((ulong)pGVar16 ^ 1));
  iVar8 = Cbs0_ManSolve_rec(p);
  if (iVar8 != 0) {
    iVar8 = (p->pProp).iTail;
    if (iVar8 < iVar7) {
      __assert_fail("iBound <= p->pProp.iTail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                    ,0x1aa,"void Cbs0_ManCancelUntil(Cbs0_Man_t *, int)");
    }
    (p->pProp).iHead = iVar7;
    if (iVar7 < iVar8) {
      lVar15 = (long)iVar7;
      do {
        pGVar4 = (p->pProp).pData[lVar15];
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        if (((uint)*(ulong *)pGVar4 >> 0x1e & 1) == 0) {
          __assert_fail("pVar->fMark0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                        ,0x54,"void Cbs0_VarUnassign(Gia_Obj_t *)");
        }
        *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xbfffffffbfffffff;
        lVar15 = lVar15 + 1;
      } while (lVar15 < (p->pProp).iTail);
    }
    (p->pProp).iTail = iVar7;
    (p->pJust).iHead = iVar2;
    (p->pJust).iTail = iVar3;
    Cbs0_ManAssign(p,pGVar16);
    iVar7 = Cbs0_ManSolve_rec(p);
    if (iVar7 != 0) {
      piVar1 = &(p->Pars).nBTThis;
      *piVar1 = *piVar1 + 1;
      iVar13 = 1;
    }
  }
  return iVar13;
}

Assistant:

int Cbs0_ManSolve_rec( Cbs0_Man_t * p )
{
    Gia_Obj_t * pVar = NULL, * pDecVar;
    int iPropHead, iJustHead, iJustTail;
    // propagate assignments
    assert( !Cbs0_QueIsEmpty(&p->pProp) );
    if ( Cbs0_ManPropagate( p ) )
        return 1;
    // check for satisfying assignment
    assert( Cbs0_QueIsEmpty(&p->pProp) );
    if ( Cbs0_QueIsEmpty(&p->pJust) )
        return 0;
    // quit using resource limits
    p->Pars.nJustThis = Abc_MaxInt( p->Pars.nJustThis, p->pJust.iTail - p->pJust.iHead );
    if ( Cbs0_ManCheckLimits( p ) )
        return 0;
    // remember the state before branching
    iPropHead = p->pProp.iHead;
    Cbs0_QueStore( &p->pJust, &iJustHead, &iJustTail );
    // find the decision variable
    if ( p->Pars.fUseHighest )
        pVar = Cbs0_ManDecideHighest( p );
    else if ( p->Pars.fUseLowest )
        pVar = Cbs0_ManDecideLowest( p );
    else if ( p->Pars.fUseMaxFF )
        pVar = Cbs0_ManDecideMaxFF( p );
    else assert( 0 );
    assert( Cbs0_VarIsJust( pVar ) );
    // chose decision variable using fanout count
    if ( Gia_ObjRefNum(p->pAig, Gia_ObjFanin0(pVar)) > Gia_ObjRefNum(p->pAig, Gia_ObjFanin1(pVar)) )
        pDecVar = Gia_Not(Gia_ObjChild0(pVar));
    else
        pDecVar = Gia_Not(Gia_ObjChild1(pVar));
    // decide on first fanin
    Cbs0_ManAssign( p, pDecVar );
    if ( !Cbs0_ManSolve_rec( p ) )
        return 0;
    Cbs0_ManCancelUntil( p, iPropHead );
    Cbs0_QueRestore( &p->pJust, iJustHead, iJustTail );
    // decide on second fanin
    Cbs0_ManAssign( p, Gia_Not(pDecVar) );
    if ( !Cbs0_ManSolve_rec( p ) )
        return 0;
    p->Pars.nBTThis++;
    return 1;
}